

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 __thiscall GYMPlayer::LoadTags(GYMPlayer *this)

{
  value_type local_28;
  value_type local_20;
  GYMPlayer *local_18;
  GYMPlayer *this_local;
  
  local_18 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->_tagData);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->_tagList);
  if ((this->_fileHdr).hasHeader == '\0') {
    local_20 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->_tagList,&local_20);
  }
  else {
    LoadTag(this,"TITLE",this->_fileData + 4,0x20);
    LoadTag(this,"GAME",this->_fileData + 0x24,0x20);
    LoadTag(this,"PUBLISHER",this->_fileData + 0x44,0x20);
    LoadTag(this,"EMULATOR",this->_fileData + 100,0x20);
    LoadTag(this,"ENCODED_BY",this->_fileData + 0x84,0x20);
    LoadTag(this,"COMMENT",this->_fileData + 0xa4,0x100);
    local_28 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->_tagList,&local_28);
  }
  return '\0';
}

Assistant:

UINT8 GYMPlayer::LoadTags(void)
{
	_tagData.clear();
	_tagList.clear();
	if (! _fileHdr.hasHeader)
	{
		_tagList.push_back(NULL);
		return 0x00;
	}
	
	LoadTag("TITLE",        &_fileData[0x04], 0x20);
	LoadTag("GAME",         &_fileData[0x24], 0x20);
	// no "ARTIST" tag in GYMX files
	LoadTag("PUBLISHER",    &_fileData[0x44], 0x20);
	LoadTag("EMULATOR",     &_fileData[0x64], 0x20);
	LoadTag("ENCODED_BY",   &_fileData[0x84], 0x20);
	LoadTag("COMMENT",      &_fileData[0xA4], 0x100);
	
	_tagList.push_back(NULL);
	return 0x00;
}